

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O0

void test_ht_4(void)

{
  int iVar1;
  spki_record *psVar2;
  long in_FS_OFFSET;
  int local_4fcc;
  int local_4fc8;
  int j_2;
  int i_2;
  int j_1;
  int i_1;
  int j;
  int i;
  uint result_len;
  spki_record *result;
  spki_record *records [50] [50];
  undefined1 local_180 [8];
  spki_table table;
  
  table.lock._48_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  spki_table_init((spki_table *)local_180,(spki_update_fp)0x0);
  for (i_1 = 0; i_1 < 0x32; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < 0x32; j_1 = j_1 + 1) {
      psVar2 = create_record(i_1,j_1,j_1,(rtr_socket *)0x0);
      records[(long)i_1 + -1][(long)j_1 + 0x31] = psVar2;
      _spki_table_add_assert((spki_table *)local_180,records[(long)i_1 + -1][(long)j_1 + 0x31]);
    }
  }
  i_2 = 0;
  do {
    if (0x31 < i_2) {
      for (local_4fc8 = 0; local_4fc8 < 0x32; local_4fc8 = local_4fc8 + 1) {
        for (local_4fcc = 0; local_4fcc < 0x32; local_4fcc = local_4fcc + 1) {
          psVar2 = create_record(local_4fc8,local_4fcc,local_4fcc,(rtr_socket *)0x0);
          records[(long)local_4fc8 + -1][(long)local_4fcc + 0x31] = psVar2;
          _spki_table_add_assert
                    ((spki_table *)local_180,records[(long)local_4fc8 + -1][(long)local_4fcc + 0x31]
                    );
          free(records[(long)local_4fc8 + -1][(long)local_4fcc + 0x31]);
        }
      }
      spki_table_free((spki_table *)local_180);
      printf("%s() complete\n","test_ht_4");
      if (*(long *)(in_FS_OFFSET + 0x28) == table.lock._48_8_) {
        return;
      }
      __stack_chk_fail();
    }
    for (j_2 = 0; j_2 < 0x32; j_2 = j_2 + 1) {
      iVar1 = spki_table_get_all((spki_table *)local_180,
                                 records[(long)i_2 + -1][(long)j_2 + 0x31]->asn,
                                 records[(long)i_2 + -1][(long)j_2 + 0x31]->ski,(spki_record **)&i,
                                 (uint *)&j);
      if (iVar1 != 0) {
        __assert_fail("spki_table_get_all(&table, records[i][j]->asn, records[i][j]->ski, &result, &result_len) == SPKI_SUCCESS"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x159,"void test_ht_4(void)");
      }
      if (j != 1) {
        __assert_fail("result_len == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                      ,0x15a,"void test_ht_4(void)");
      }
      _spki_table_remove_assert((spki_table *)local_180,records[(long)i_2 + -1][(long)j_2 + 0x31]);
      free(_i);
      free(records[(long)i_2 + -1][(long)j_2 + 0x31]);
    }
    i_2 = i_2 + 1;
  } while( true );
}

Assistant:

static void test_ht_4(void)
{
	struct spki_table table;
	struct spki_record *result;
	unsigned int result_len;
	struct spki_record *records[NUM_TABLE_X][NUM_TABLE_Y];

	spki_table_init(&table, NULL);
	/* Add 50 * 50 entries */
	for (int i = 0; i < NUM_TABLE_X; i++) {
		for (int j = 0; j < NUM_TABLE_Y; j++) {
			records[i][j] = create_record(i, j, j, NULL);
			_spki_table_add_assert(&table, records[i][j]);
		}
	}

	/* Check if every record is there and then delete it */
	for (int i = 0; i < NUM_TABLE_X; i++) {
		for (int j = 0; j < NUM_TABLE_Y; j++) {
			assert(spki_table_get_all(&table, records[i][j]->asn, records[i][j]->ski, &result,
						  &result_len) == SPKI_SUCCESS);
			assert(result_len == 1);
			_spki_table_remove_assert(&table, records[i][j]);
			free(result);
			free(records[i][j]);
		}
	}

	/* Add all record again and look for SPKI_DUPLICATE_RECORD */
	for (int i = 0; i < NUM_TABLE_X; i++) {
		for (int j = 0; j < NUM_TABLE_Y; j++) {
			records[i][j] = create_record(i, j, j, NULL);
			_spki_table_add_assert(&table, records[i][j]);
			free(records[i][j]);
		}
	}

	/* cleanup: free memory */
	spki_table_free(&table);
	printf("%s() complete\n", __func__);
}